

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeModuleDefinitionInfo
          (cmGeneratorTarget *this,string *config,ModuleDefinitionInfo *info)

{
  cmMakefile *this_00;
  pointer ppcVar1;
  pointer ppcVar2;
  bool bVar3;
  string obj_dir;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  GetModuleDefinitionSources(this,&info->Sources,config);
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS",&local_61);
  bVar3 = cmMakefile::IsOn(this_00,&local_40);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"WINDOWS_EXPORT_ALL_SYMBOLS",&local_62);
    bVar3 = GetPropertyAsBool(this,&local_60);
    info->WindowsExportAllSymbols = bVar3;
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    info->WindowsExportAllSymbols = false;
  }
  std::__cxx11::string::~string((string *)&local_40);
  if (info->WindowsExportAllSymbols == false) {
    ppcVar1 = (info->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = (info->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar3 = (ulong)((long)ppcVar2 - (long)ppcVar1) < 9;
    info->DefFileGenerated = !bVar3;
    if (bVar3) {
      if (ppcVar1 == ppcVar2) {
        return;
      }
      cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar1);
      std::__cxx11::string::_M_assign((string *)info);
      return;
    }
  }
  else {
    info->DefFileGenerated = true;
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x16])
            (&local_60,this->GlobalGenerator,&this->ObjectDirectory,config);
  std::operator+(&local_40,&local_60,"exports.def");
  std::__cxx11::string::operator=((string *)info,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeModuleDefinitionInfo(
  std::string const& config, ModuleDefinitionInfo& info) const
{
  this->GetModuleDefinitionSources(info.Sources, config);
  info.WindowsExportAllSymbols =
    this->Makefile->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS") &&
    this->GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS");
#if !defined(CMAKE_BOOTSTRAP)
  info.DefFileGenerated =
    info.WindowsExportAllSymbols || info.Sources.size() > 1;
#else
  // Our __create_def helper is not available during CMake bootstrap.
  info.DefFileGenerated = false;
#endif
  if (info.DefFileGenerated) {
    info.DefFile =
      this->GetObjectDirectory(config) /* has slash */ + "exports.def";
  } else if (!info.Sources.empty()) {
    info.DefFile = info.Sources.front()->GetFullPath();
  }
}